

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O3

SpatialBinSplit<16UL> * __thiscall
embree::avx::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int dim;
  long lVar21;
  ulong uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  undefined1 auStack_808 [16];
  float afStack_7f8 [64];
  undefined1 auStack_6f8 [1200];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [2] [16];
  float afStack_1f8 [126];
  
  paVar17 = &this->bounds[0xf][2].upper.field_0;
  auVar24._8_4_ = 0x7f800000;
  auVar24._0_8_ = 0x7f8000007f800000;
  auVar24._12_4_ = 0x7f800000;
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar29 = ZEXT1664((undefined1  [16])0x0);
  lVar20 = 0x7f0;
  auVar30 = auVar26;
  auVar28 = auVar24;
  auVar4 = auVar26;
  auVar5 = auVar24;
  do {
    auVar31 = vpaddd_avx(auVar29._0_16_,
                         *(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar20));
    auVar29 = ZEXT1664(auVar31);
    *(undefined1 (*) [16])(auStack_808 + lVar20) = auVar31;
    auVar24 = vminps_avx(auVar24,(undefined1  [16])paVar17[-5]);
    auVar26 = vmaxps_avx(auVar26,(undefined1  [16])paVar17[-4]);
    auVar32 = vsubps_avx(auVar26,auVar24);
    auVar28 = vminps_avx(auVar28,(undefined1  [16])paVar17[-3]);
    auVar30 = vmaxps_avx(auVar30,(undefined1  [16])paVar17[-2]);
    auVar33 = vsubps_avx(auVar30,auVar28);
    auVar31 = vinsertps_avx(auVar33,auVar32,0x4c);
    auVar7 = vshufpd_avx(auVar32,auVar32,1);
    auVar7 = vinsertps_avx(auVar7,auVar33,0x9c);
    auVar32 = vunpcklps_avx(auVar32,auVar33);
    auVar33._0_4_ = auVar31._0_4_ * auVar7._0_4_ + (auVar31._0_4_ + auVar7._0_4_) * auVar32._0_4_;
    auVar33._4_4_ = auVar31._4_4_ * auVar7._4_4_ + (auVar31._4_4_ + auVar7._4_4_) * auVar32._4_4_;
    auVar33._8_4_ = auVar31._8_4_ * auVar7._8_4_ + (auVar31._8_4_ + auVar7._8_4_) * auVar32._8_4_;
    auVar33._12_4_ =
         auVar31._12_4_ * auVar7._12_4_ + (auVar31._12_4_ + auVar7._12_4_) * auVar32._12_4_;
    uVar2 = vmovlps_avx(auVar33);
    *(undefined8 *)((long)&uStack_908 + lVar20) = uVar2;
    auVar5 = vminps_avx(auVar5,(undefined1  [16])paVar17[-1]);
    auVar4 = vmaxps_avx(auVar4,(undefined1  [16])*paVar17);
    auVar32 = vsubps_avx(auVar4,auVar5);
    auVar31 = vmovshdup_avx(auVar32);
    auVar7 = vshufpd_avx(auVar32,auVar32,1);
    *(float *)((long)afStack_900 + lVar20) =
         auVar31._0_4_ * auVar7._0_4_ + (auVar31._0_4_ + auVar7._0_4_) * auVar32._0_4_;
    *(undefined4 *)((long)afStack_900 + lVar20 + 4) = 0;
    lVar20 = lVar20 + -0x10;
    paVar17 = paVar17 + -6;
  } while (lVar20 != 0x700);
  uVar18 = 0xffffffff;
  auVar7 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)blocks_shift & 0x1f))),0);
  local_228 = (undefined1  [16])0x0;
  auVar32._8_8_ = 0x100000001;
  auVar32._0_8_ = 0x100000001;
  auVar28._8_4_ = 0x7f800000;
  auVar28._0_8_ = 0x7f8000007f800000;
  auVar28._12_4_ = 0x7f800000;
  auVar30._8_4_ = 0xff800000;
  auVar30._0_8_ = 0xff800000ff800000;
  auVar30._12_4_ = 0xff800000;
  auVar31 = ZEXT816(0) << 0x20;
  lVar20 = 0x50;
  lVar21 = 0x600;
  local_238 = ZEXT816(0);
  local_248 = ZEXT816(0) << 0x20;
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  auVar26 = auVar30;
  auVar24 = auVar28;
  auVar4 = auVar30;
  auVar5 = auVar28;
  local_218[0] = auVar28;
  do {
    auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar20));
    auVar30 = vmaxps_avx(auVar30,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar20));
    auVar27 = vsubps_avx(auVar30,auVar28);
    auVar24 = vminps_avx(auVar24,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar20));
    auVar26 = vmaxps_avx(auVar26,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar20));
    auVar5 = vminps_avx(auVar5,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar20));
    auVar4 = vmaxps_avx(auVar4,*(undefined1 (*) [16])
                                ((long)&this->bounds[0][0].lower.field_0 + lVar20));
    auVar8 = vsubps_avx(auVar26,auVar24);
    auVar9 = vsubps_avx(auVar4,auVar5);
    auVar33 = vshufps_avx(auVar27,auVar9,0x65);
    auVar33 = vblendps_avx(auVar33,auVar8,2);
    auVar34 = vshufps_avx(auVar27,auVar9,0x96);
    auVar3 = vinsertps_avx(auVar34,auVar8,0x90);
    auVar31 = vpaddd_avx(auVar31,*(undefined1 (*) [16])
                                  ((long)&this->bounds[0][0].lower.field_0 + lVar21));
    auVar34 = vshufps_avx(auVar27,auVar9,0);
    auVar8 = vinsertps_avx(auVar34,auVar8,0x10);
    auVar34 = vpaddd_avx(auVar7,auVar31);
    auVar27 = vpsrld_avx(auVar34,ZEXT416((uint)blocks_shift));
    auVar34 = vpaddd_avx(auVar7,*(undefined1 (*) [16])(auStack_6f8 + lVar21));
    auVar25 = vpsrld_avx(auVar34,ZEXT416((uint)blocks_shift));
    auVar34 = vpsrad_avx(auVar27,0x1f);
    auVar6._8_8_ = 0x4f0000004f000000;
    auVar6._0_8_ = 0x4f0000004f000000;
    auVar9 = vpand_avx(auVar34,auVar6);
    auVar34 = vpand_avx(auVar35,auVar27);
    auVar34 = vcvtdq2ps_avx(auVar34);
    auVar27 = vpsrad_avx(auVar25,0x1f);
    auVar6 = vpand_avx(auVar6,auVar27);
    auVar27 = vpand_avx(auVar35,auVar25);
    auVar27 = vcvtdq2ps_avx(auVar27);
    auVar25._0_4_ =
         ((auVar33._0_4_ + auVar3._0_4_) * auVar8._0_4_ + auVar33._0_4_ * auVar3._0_4_) *
         (auVar9._0_4_ + auVar34._0_4_) +
         (auVar27._0_4_ + auVar6._0_4_) * *(float *)((long)afStack_7f8 + lVar21);
    auVar25._4_4_ =
         ((auVar33._4_4_ + auVar3._4_4_) * auVar8._4_4_ + auVar33._4_4_ * auVar3._4_4_) *
         (auVar9._4_4_ + auVar34._4_4_) +
         (auVar27._4_4_ + auVar6._4_4_) * *(float *)((long)afStack_7f8 + lVar21 + 4);
    auVar25._8_4_ =
         ((auVar33._8_4_ + auVar3._8_4_) * auVar8._8_4_ + auVar33._8_4_ * auVar3._8_4_) *
         (auVar9._8_4_ + auVar34._8_4_) +
         (auVar27._8_4_ + auVar6._8_4_) * *(float *)((long)afStack_7f8 + lVar21 + 8);
    auVar25._12_4_ =
         ((auVar33._12_4_ + auVar3._12_4_) * auVar8._12_4_ + auVar33._12_4_ * auVar3._12_4_) *
         (auVar9._12_4_ + auVar34._12_4_) +
         (auVar27._12_4_ + auVar6._12_4_) * *(float *)((long)afStack_7f8 + lVar21 + 0xc);
    auVar33 = vcmpps_avx(auVar25,local_218[0],1);
    local_218[0] = vminps_avx(auVar25,local_218[0]);
    local_248 = vblendvps_avx(local_248,*(undefined1 (*) [16])(auStack_6f8 + lVar21),auVar33);
    local_228 = vblendvps_avx(local_228,auVar32,auVar33);
    local_238 = vblendvps_avx(local_238,auVar31,auVar33);
    auVar32 = vpsubd_avx(auVar32,_DAT_01f7ae20);
    lVar20 = lVar20 + 0x60;
    lVar21 = lVar21 + 0x10;
  } while (lVar20 != 0x5f0);
  fVar23 = INFINITY;
  uVar22 = 0;
  iVar16 = 0;
  iVar15 = 0;
  iVar19 = 0;
  do {
    fVar1 = (mapping->scale).field_0.v[uVar22];
    if ((((fVar1 != 0.0) || (NAN(fVar1))) && (afStack_1f8[uVar22 - 8] < fVar23)) &&
       (*(int *)(local_228 + uVar22 * 4) != 0)) {
      iVar15 = *(int *)(local_238 + uVar22 * 4);
      iVar16 = *(int *)(local_248 + uVar22 * 4);
      uVar18 = uVar22 & 0xffffffff;
      iVar19 = *(int *)(local_228 + uVar22 * 4);
      fVar23 = afStack_1f8[uVar22 - 8];
    }
    uVar22 = uVar22 + 1;
  } while (uVar22 != 3);
  if ((int)uVar18 == -1) {
    iVar15 = -1;
    iVar19 = 0;
    fVar23 = INFINITY;
    iVar16 = iVar15;
  }
  uVar2 = *(undefined8 *)&(mapping->inv_scale).field_0;
  uVar10 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  uVar11 = *(undefined8 *)&(mapping->ofs).field_0;
  uVar12 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  uVar13 = *(undefined8 *)&(mapping->scale).field_0;
  uVar14 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  __return_storage_ptr__->sah = fVar23;
  __return_storage_ptr__->dim = (int)uVar18;
  __return_storage_ptr__->pos = iVar19;
  __return_storage_ptr__->left = iVar15;
  __return_storage_ptr__->right = iVar16;
  __return_storage_ptr__->factor = 1.0;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar11;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar12;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = uVar13;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar14;
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 = uVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar10;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }